

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O0

CURLcode formdata_add_filename(curl_httppost *file,FormData **form,curl_off_t *size)

{
  curl_malloc_callback p_Var1;
  char *pcVar2;
  size_t sVar3;
  char *local_58;
  char *p1;
  char *p0;
  char *filename_escaped;
  char *filebasename;
  char *filename;
  CURLcode result;
  curl_off_t *size_local;
  FormData **form_local;
  curl_httppost *file_local;
  
  filebasename = file->showfilename;
  filename_escaped = (char *)0x0;
  p0 = (char *)0x0;
  if ((filebasename == (char *)0x0) &&
     (filename_escaped = strippath(file->contents), filebasename = filename_escaped,
     filename_escaped == (char *)0x0)) {
    file_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    pcVar2 = strchr(filebasename,0x5c);
    if ((pcVar2 != (char *)0x0) || (pcVar2 = strchr(filebasename,0x22), pcVar2 != (char *)0x0)) {
      p_Var1 = Curl_cmalloc;
      sVar3 = strlen(filebasename);
      p0 = (char *)(*p_Var1)(sVar3 * 2 + 1);
      if (p0 == (char *)0x0) {
        if (filename_escaped != (char *)0x0) {
          (*Curl_cfree)(filename_escaped);
        }
        return CURLE_OUT_OF_MEMORY;
      }
      local_58 = filebasename;
      p1 = p0;
      while (*local_58 != '\0') {
        if ((*local_58 == '\\') || (*local_58 == '\"')) {
          *p1 = '\\';
          p1 = p1 + 1;
        }
        *p1 = *local_58;
        local_58 = local_58 + 1;
        p1 = p1 + 1;
      }
      *p1 = '\0';
      filebasename = p0;
    }
    file_local._4_4_ = AddFormDataf(form,size,"; filename=\"%s\"",filebasename);
    if (p0 != (char *)0x0) {
      (*Curl_cfree)(p0);
    }
    if (filename_escaped != (char *)0x0) {
      (*Curl_cfree)(filename_escaped);
    }
  }
  return file_local._4_4_;
}

Assistant:

static CURLcode formdata_add_filename(const struct curl_httppost *file,
                                      struct FormData **form,
                                      curl_off_t *size)
{
  CURLcode result = CURLE_OK;
  char *filename = file->showfilename;
  char *filebasename = NULL;
  char *filename_escaped = NULL;

  if(!filename) {
    filebasename = strippath(file->contents);
    if(!filebasename)
      return CURLE_OUT_OF_MEMORY;
    filename = filebasename;
  }

  if(strchr(filename, '\\') || strchr(filename, '"')) {
    char *p0, *p1;

    /* filename need be escaped */
    filename_escaped = malloc(strlen(filename)*2+1);
    if(!filename_escaped) {
      Curl_safefree(filebasename);
      return CURLE_OUT_OF_MEMORY;
    }
    p0 = filename_escaped;
    p1 = filename;
    while(*p1) {
      if(*p1 == '\\' || *p1 == '"')
        *p0++ = '\\';
      *p0++ = *p1++;
    }
    *p0 = '\0';
    filename = filename_escaped;
  }
  result = AddFormDataf(form, size,
                        "; filename=\"%s\"",
                        filename);
  Curl_safefree(filename_escaped);
  Curl_safefree(filebasename);
  return result;
}